

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

iterator __thiscall
google::protobuf::RepeatedField<double>::erase(RepeatedField<double> *this,const_iterator position)

{
  void *__dest;
  LogMessage *other;
  int iVar1;
  void *pvVar2;
  size_t __n;
  long lVar3;
  int iVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  pvVar2 = this->arena_or_elements_;
  iVar1 = this->current_size_;
  lVar3 = (long)(int)((ulong)((long)position - (long)pvVar2) >> 3);
  __dest = (void *)((long)pvVar2 + lVar3 * 8);
  __n = (long)pvVar2 + ((long)iVar1 * 8 - (long)(position + 1));
  if (__n != 0) {
    memmove(__dest,position + 1,__n);
    pvVar2 = this->arena_or_elements_;
    iVar1 = this->current_size_;
  }
  iVar4 = (int)((long)__dest + (__n - (long)pvVar2) >> 3);
  if (iVar1 < iVar4) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x649);
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (new_size) <= (current_size_): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
    iVar1 = this->current_size_;
  }
  if (0 < iVar1) {
    this->current_size_ = iVar4;
  }
  return (iterator)(lVar3 * 8 + (long)this->arena_or_elements_);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}